

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O3

string * __thiscall
SndIOBackendFactory::probe_abi_cxx11_
          (string *__return_storage_ptr__,SndIOBackendFactory *this,BackendType type)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (type < 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,0x193584);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SndIOBackendFactory::probe(BackendType type)
{
    std::string outnames;
    switch(type)
    {
    case BackendType::Playback:
    case BackendType::Capture:
        /* Includes null char. */
        outnames.append(sndio_device, sizeof(sndio_device));
        break;
    }
    return outnames;
}